

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.hpp
# Opt level: O3

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)0>::draw_tms_character<(TI::TMS::SpriteMode)0>
          (Base<(TI::TMS::Personality)0> *this,int start,int end)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  iterator pvVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint32_t *puVar12;
  uint local_38 [2];
  
  pvVar4 = this->draw_line_buffer_;
  if (this->screen_mode_ == MultiColour) {
    if (start < end) {
      puVar12 = this->pixel_target_;
      lVar10 = 0;
      do {
        iVar6 = start + (int)lVar10;
        puVar12[start + lVar10] =
             default_palette._M_elems
             [(pvVar4->field_5).bitmap[(long)(iVar6 >> 3) * 4 + 0x20] >> (~(byte)iVar6 & 4) & 0xf];
        lVar10 = lVar10 + 1;
      } while ((long)end - (long)start != lVar10);
    }
  }
  else {
    uVar7 = end - start;
    uVar8 = 8 - (start & 7U);
    if ((int)uVar7 <= (int)uVar8) {
      uVar8 = uVar7;
    }
    uVar9 = (ulong)uVar8;
    lVar10 = (long)(start >> 3);
    bVar3 = (byte)(&DAT_004691c0)[(pvVar4->field_5).bitmap[lVar10 * 4 + 0x20]] >>
            (sbyte)(start & 7U);
    bVar2 = (pvVar4->field_5).bitmap[lVar10 * 4 + 0x21];
    uVar11 = (ulong)(bVar2 & 0xf);
    if ((bVar2 & 0xf) == 0) {
      uVar11 = (ulong)this->background_colour_;
    }
    local_38[0] = default_palette._M_elems[uVar11];
    bVar5 = bVar2 >> 4;
    if (bVar2 < 0x10) {
      bVar5 = this->background_colour_;
    }
    puVar12 = this->pixel_target_;
    while( true ) {
      uVar8 = (uint)bVar3;
      local_38[1] = default_palette._M_elems[bVar5];
      iVar6 = (int)uVar9;
      if (0 < iVar6) {
        uVar11 = 0;
        do {
          puVar12[uVar11] = local_38[uVar8 & 1];
          uVar8 = uVar8 >> 1;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      puVar12 = puVar12 + iVar6;
      this->pixel_target_ = puVar12;
      uVar7 = uVar7 - iVar6;
      if (uVar7 == 0) break;
      uVar9 = 8;
      if ((int)uVar7 < 8) {
        uVar9 = (ulong)uVar7;
      }
      lVar1 = lVar10 * 4;
      bVar2 = (pvVar4->field_5).bitmap[lVar10 * 4 + 0x25];
      lVar10 = lVar10 + 1;
      bVar3 = (&DAT_004691c0)[(pvVar4->field_5).bitmap[lVar1 + 0x24]];
      uVar11 = (ulong)(bVar2 & 0xf);
      if ((bVar2 & 0xf) == 0) {
        uVar11 = (ulong)this->background_colour_;
      }
      local_38[0] = default_palette._M_elems[uVar11];
      bVar5 = bVar2 >> 4;
      if (bVar2 < 0x10) {
        bVar5 = this->background_colour_;
      }
    }
  }
  draw_sprites<(TI::TMS::SpriteMode)0,false>(this,'\0',start,end,&default_palette,(int *)0x0);
  return;
}

Assistant:

void Base<personality>::draw_tms_character(int start, int end) {
	auto &line_buffer = *draw_line_buffer_;

	// Paint the background tiles.
	const int pixels_left = end - start;
	if(this->screen_mode_ == ScreenMode::MultiColour) {
		for(int c = start; c < end; ++c) {
			pixel_target_[c] = palette()[
				(line_buffer.tiles.patterns[c >> 3][0] >> (((c & 4)^4))) & 15
			];
		}
	} else {
		const int shift = start & 7;
		int byte_column = start >> 3;

		int length = std::min(pixels_left, 8 - shift);

		int pattern = Numeric::bit_reverse(line_buffer.tiles.patterns[byte_column][0]) >> shift;
		uint8_t colour = line_buffer.tiles.patterns[byte_column][1];
		uint32_t colours[2] = {
			palette()[(colour & 15) ? (colour & 15) : background_colour_],
			palette()[(colour >> 4) ? (colour >> 4) : background_colour_]
		};

		int background_pixels_left = pixels_left;
		while(true) {
			background_pixels_left -= length;
			for(int c = 0; c < length; ++c) {
				pixel_target_[c] = colours[pattern&0x01];
				pattern >>= 1;
			}
			pixel_target_ += length;

			if(!background_pixels_left) break;
			length = std::min(8, background_pixels_left);
			byte_column++;

			pattern = Numeric::bit_reverse(line_buffer.tiles.patterns[byte_column][0]);
			colour = line_buffer.tiles.patterns[byte_column][1];
			colours[0] = palette()[(colour & 15) ? (colour & 15) : background_colour_];
			colours[1] = palette()[(colour >> 4) ? (colour >> 4) : background_colour_];
		}
	}

	draw_sprites<sprite_mode, false>(0, start, end, palette());	// TODO: propagate a real 'y' into here.
}